

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.hpp
# Opt level: O0

void __thiscall
Strings::StringArrayT<Bstrlib::String>::StringArrayT
          (StringArrayT<Bstrlib::String> *this,int referenceSize,char **innerArray)

{
  TPtr *ppSVar1;
  String *this_00;
  ulong local_28;
  size_t i;
  char **innerArray_local;
  int referenceSize_local;
  StringArrayT<Bstrlib::String> *this_local;
  
  ppSVar1 = (TPtr *)realloc((void *)0x0,(long)referenceSize << 3);
  this->array = ppSVar1;
  this->currentSize = (long)referenceSize;
  this->allocatedSize = (long)referenceSize;
  if (this->array == (TPtr *)0x0) {
    this->allocatedSize = 0;
    this->currentSize = 0;
  }
  else if (innerArray == (char **)0x0) {
    memset(this->array,0,(long)referenceSize << 3);
  }
  else {
    for (local_28 = 0; local_28 < (ulong)(long)referenceSize; local_28 = local_28 + 1) {
      this_00 = (String *)operator_new(0x10);
      Bstrlib::String::String(this_00,innerArray[local_28]);
      this->array[local_28] = this_00;
    }
  }
  return;
}

Assistant:

inline StringArrayT(const int referenceSize, const char ** innerArray)
            : array((TPtr*)realloc(NULL, referenceSize * sizeof(array[0]))), currentSize(referenceSize), allocatedSize(referenceSize)
        {
            if (!array) currentSize = allocatedSize = 0;
            else if (innerArray) for (size_t i = 0; i < referenceSize; i++) array[i] = new T(innerArray[i]);
            else memset(array, 0, referenceSize * sizeof(*array));
        }